

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_37bab4::MLDSATest_SigGenTests65_Test::TestBody
          (MLDSATest_SigGenTests65_Test *this)

{
  function<void_(FileTest_*)> local_30;
  MLDSATest_SigGenTests65_Test *local_10;
  MLDSATest_SigGenTests65_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::function<void(&)(FileTest*),void>
            ((function<void(FileTest*)> *)&local_30,
             MLDSASigGenTest<BCM_mldsa65_private_key,_BCM_mldsa65_public_key,_3309UL,_&BCM_mldsa65_parse_private_key,_&BCM_mldsa65_sign_internal,_&BCM_mldsa65_public_from_private,_&BCM_mldsa65_verify_internal>
            );
  FileTestGTest("crypto/mldsa/mldsa_nist_siggen_65_tests.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(MLDSATest, SigGenTests65) {
  FileTestGTest(
      "crypto/mldsa/mldsa_nist_siggen_65_tests.txt",
      MLDSASigGenTest<BCM_mldsa65_private_key, BCM_mldsa65_public_key,
                      MLDSA65_SIGNATURE_BYTES, BCM_mldsa65_parse_private_key,
                      BCM_mldsa65_sign_internal,
                      BCM_mldsa65_public_from_private,
                      BCM_mldsa65_verify_internal>);
}